

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldDescriptorProto::Clear(FieldDescriptorProto *this)

{
  uint uVar1;
  long in_RDI;
  uint32 cached_has_bits;
  FieldOptions *in_stack_ffffffffffffff60;
  
  uVar1 = *(uint *)(in_RDI + 0x10);
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x4f8e7c);
    }
    if ((uVar1 & 2) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x4f8e96);
    }
    if ((uVar1 & 4) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x4f8eb0);
    }
    if ((uVar1 & 8) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x4f8eca);
    }
    if ((uVar1 & 0x10) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x4f8ee4);
    }
    if ((uVar1 & 0x20) != 0) {
      FieldOptions::Clear(in_stack_ffffffffffffff60);
    }
  }
  if ((uVar1 & 0xc0) != 0) {
    memset((void *)(in_RDI + 0x48),0,8);
  }
  if ((uVar1 & 0x300) != 0) {
    *(undefined4 *)(in_RDI + 0x50) = 1;
    *(undefined4 *)(in_RDI + 0x54) = 1;
  }
  memset((void *)(in_RDI + 0x10),0,4);
  if (((uint)(((InternalMetadataWithArena *)(in_RDI + 8))->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear((InternalMetadataWithArena *)(in_RDI + 8));
  }
  return;
}

Assistant:

void FieldDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FieldDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      extendee_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000004u) {
      type_name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000008u) {
      default_value_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000010u) {
      json_name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000020u) {
      GOOGLE_DCHECK(options_ != nullptr);
      options_->Clear();
    }
  }
  if (cached_has_bits & 0x000000c0u) {
    ::memset(&number_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&oneof_index_) -
        reinterpret_cast<char*>(&number_)) + sizeof(oneof_index_));
  }
  if (cached_has_bits & 0x00000300u) {
    label_ = 1;
    type_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}